

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabFinishParse(Parse *pParse,Token *pEnd)

{
  Table *pTab_00;
  sqlite3 *db_00;
  Schema *pSVar1;
  int iDb_00;
  int iDest;
  char *pcVar2;
  Vdbe *p;
  char *zWhere_00;
  void *pvVar3;
  char *zName;
  Schema *pSchema;
  Table *pOld;
  Vdbe *v;
  int iReg;
  int iDb;
  char *zWhere;
  char *zStmt;
  sqlite3 *db;
  Table *pTab;
  Token *pEnd_local;
  Parse *pParse_local;
  
  pTab_00 = pParse->pNewTable;
  db_00 = pParse->db;
  if (pTab_00 != (Table *)0x0) {
    addArgumentToVtab(pParse);
    (pParse->sArg).z = (char *)0x0;
    if (0 < (pTab_00->u).tab.addColOffset) {
      if ((db_00->init).busy == '\0') {
        sqlite3MayAbort(pParse);
        if (pEnd != (Token *)0x0) {
          (pParse->sNameToken).n = ((int)pEnd->z - (int)(pParse->sNameToken).z) + pEnd->n;
        }
        pcVar2 = sqlite3MPrintf(db_00,"CREATE VIRTUAL TABLE %T",&pParse->sNameToken);
        iDb_00 = sqlite3SchemaToIndex(db_00,pTab_00->pSchema);
        sqlite3NestedParse(pParse,
                           "UPDATE %Q.sqlite_master SET type=\'table\', name=%Q, tbl_name=%Q, rootpage=0, sql=%Q WHERE rowid=#%d"
                           ,db_00->aDb[iDb_00].zDbSName,pTab_00->zName,pTab_00->zName,pcVar2,
                           pParse->regRowid);
        p = sqlite3GetVdbe(pParse);
        sqlite3ChangeCookie(pParse,iDb_00);
        sqlite3VdbeAddOp0(p,0xa6);
        zWhere_00 = sqlite3MPrintf(db_00,"name=%Q AND sql=%Q",pTab_00->zName);
        sqlite3VdbeAddParseSchemaOp(p,iDb_00,zWhere_00,0);
        sqlite3DbFree(db_00,pcVar2);
        iDest = pParse->nMem + 1;
        pParse->nMem = iDest;
        sqlite3VdbeLoadString(p,iDest,pTab_00->zName);
        sqlite3VdbeAddOp2(p,0xab,iDb_00,iDest);
      }
      else {
        pSVar1 = pTab_00->pSchema;
        pcVar2 = pTab_00->zName;
        sqlite3MarkAllShadowTablesOf(db_00,pTab_00);
        pvVar3 = sqlite3HashInsert(&pSVar1->tblHash,pcVar2,pTab_00);
        if (pvVar3 == (void *)0x0) {
          pParse->pNewTable = (Table *)0x0;
        }
        else {
          sqlite3OomFault(db_00);
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabFinishParse(Parse *pParse, Token *pEnd){
  Table *pTab = pParse->pNewTable;  /* The table being constructed */
  sqlite3 *db = pParse->db;         /* The database connection */

  if( pTab==0 ) return;
  assert( IsVirtual(pTab) );
  addArgumentToVtab(pParse);
  pParse->sArg.z = 0;
  if( pTab->u.vtab.nArg<1 ) return;

  /* If the CREATE VIRTUAL TABLE statement is being entered for the
  ** first time (in other words if the virtual table is actually being
  ** created now instead of just being read out of sqlite_schema) then
  ** do additional initialization work and store the statement text
  ** in the sqlite_schema table.
  */
  if( !db->init.busy ){
    char *zStmt;
    char *zWhere;
    int iDb;
    int iReg;
    Vdbe *v;

    sqlite3MayAbort(pParse);

    /* Compute the complete text of the CREATE VIRTUAL TABLE statement */
    if( pEnd ){
      pParse->sNameToken.n = (int)(pEnd->z - pParse->sNameToken.z) + pEnd->n;
    }
    zStmt = sqlite3MPrintf(db, "CREATE VIRTUAL TABLE %T", &pParse->sNameToken);

    /* A slot for the record has already been allocated in the
    ** schema table.  We just need to update that slot with all
    ** the information we've collected.
    **
    ** The VM register number pParse->regRowid holds the rowid of an
    ** entry in the sqlite_schema table tht was created for this vtab
    ** by sqlite3StartTable().
    */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3NestedParse(pParse,
      "UPDATE %Q." LEGACY_SCHEMA_TABLE " "
         "SET type='table', name=%Q, tbl_name=%Q, rootpage=0, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName,
      pTab->zName,
      pTab->zName,
      zStmt,
      pParse->regRowid
    );
    v = sqlite3GetVdbe(pParse);
    sqlite3ChangeCookie(pParse, iDb);

    sqlite3VdbeAddOp0(v, OP_Expire);
    zWhere = sqlite3MPrintf(db, "name=%Q AND sql=%Q", pTab->zName, zStmt);
    sqlite3VdbeAddParseSchemaOp(v, iDb, zWhere, 0);
    sqlite3DbFree(db, zStmt);

    iReg = ++pParse->nMem;
    sqlite3VdbeLoadString(v, iReg, pTab->zName);
    sqlite3VdbeAddOp2(v, OP_VCreate, iDb, iReg);
  }else{
    /* If we are rereading the sqlite_schema table create the in-memory
    ** record of the table. */
    Table *pOld;
    Schema *pSchema = pTab->pSchema;
    const char *zName = pTab->zName;
    assert( zName!=0 );
    sqlite3MarkAllShadowTablesOf(db, pTab);
    pOld = sqlite3HashInsert(&pSchema->tblHash, zName, pTab);
    if( pOld ){
      sqlite3OomFault(db);
      assert( pTab==pOld );  /* Malloc must have failed inside HashInsert() */
      return;
    }
    pParse->pNewTable = 0;
  }
}